

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::anon_unknown_8::LogFileObject::SetExtension(LogFileObject *this,char *ext)

{
  bool bVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  char *ext_local;
  LogFileObject *this_local;
  
  l._M_device = (mutex_type *)ext;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  bVar1 = std::operator!=(&this->filename_extension_,(char *)l._M_device);
  if (bVar1) {
    bVar1 = std::operator!=(&this->file_,(nullptr_t)0x0);
    if (bVar1) {
      std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::operator=
                (&this->file_,(nullptr_t)0x0);
      this->rollover_attempt_ = 0x1f;
    }
    std::__cxx11::string::operator=((string *)&this->filename_extension_,(char *)l._M_device);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void LogFileObject::SetExtension(const char* ext) {
  std::lock_guard<std::mutex> l{mutex_};
  if (filename_extension_ != ext) {
    // Get rid of old log file since we are changing names
    if (file_ != nullptr) {
      file_ = nullptr;
      rollover_attempt_ = kRolloverAttemptFrequency - 1;
    }
    filename_extension_ = ext;
  }
}